

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteTags(CWriter *this)

{
  bool bVar1;
  vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_> *this_00;
  reference ppTVar2;
  Newline local_59;
  GlobalName local_58;
  char *local_48;
  undefined1 local_39;
  Tag *pTStack_38;
  bool is_import;
  Tag *tag;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_> *__range2;
  Index tag_index;
  CWriter *this_local;
  
  Write();
  __range2._0_4_ = 0;
  this_00 = &this->module_->tags;
  __end2 = std::vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>::begin(this_00);
  tag = (Tag *)std::vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wabt::Tag_*const_*,_std::vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>_>
                                *)&tag);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<wabt::Tag_*const_*,_std::vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>_>
              ::operator*(&__end2);
    pTStack_38 = *ppTVar2;
    local_39 = (uint)__range2 < this->module_->num_tag_imports;
    if (!(bool)local_39) {
      local_48 = InternalSymbolScope(this);
      GlobalName::GlobalName(&local_58,Tag,&pTStack_38->name);
      (anonymous_namespace)::CWriter::
      Write<char_const*,char_const(&)[30],wabt::(anonymous_namespace)::GlobalName,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,&local_48,(char (*) [30])0x238ae0,&local_58,(char (*) [2])0x238bef,
                 &local_59);
    }
    __range2._0_4_ = (uint)__range2 + 1;
    __gnu_cxx::
    __normal_iterator<wabt::Tag_*const_*,_std::vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>_>::
    operator++(&__end2);
  }
  return;
}

Assistant:

void CWriter::WriteTags() {
  Write(Newline());
  Index tag_index = 0;
  for (const Tag* tag : module_->tags) {
    bool is_import = tag_index < module_->num_tag_imports;
    if (!is_import) {
      Write(InternalSymbolScope(), "const wasm_tag_placeholder_t ",
            GlobalName(ModuleFieldType::Tag, tag->name), ";", Newline());
    }
    tag_index++;
  }
}